

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-spell.c
# Opt level: O0

void create_mon_spell_mask(bitflag *f,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  uint *local_118;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  uint local_38;
  undefined4 local_34;
  va_list args;
  mon_spell_info *pmStack_18;
  wchar_t i;
  mon_spell_info *rs;
  bitflag *f_local;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_e0 = in_RSI;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  flag_wipe(f,0xd);
  args[0].overflow_arg_area = local_e8;
  args[0]._0_8_ = &stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x10;
  args[0].reg_save_area._4_4_ = (uint)local_e0;
  while (args[0].reg_save_area._4_4_ != 0) {
    for (pmStack_18 = mon_spell_types; pmStack_18->index < 0x61; pmStack_18 = pmStack_18 + 1) {
      if ((pmStack_18->type & args[0].reg_save_area._4_4_) != 0) {
        flag_on_dbg(f,0xd,(uint)pmStack_18->index,"f","rs->index");
      }
    }
    if (local_38 < 0x29) {
      local_118 = (uint *)((long)(int)local_38 + (long)args[0].overflow_arg_area);
      local_38 = local_38 + 8;
    }
    else {
      local_118 = (uint *)args[0]._0_8_;
      args[0]._0_8_ = args[0]._0_8_ + 8;
    }
    args[0].reg_save_area._4_4_ = *local_118;
  }
  return;
}

Assistant:

void create_mon_spell_mask(bitflag *f, ...)
{
	const struct mon_spell_info *rs;
	int i;
	va_list args;

	rsf_wipe(f);

	va_start(args, f);

	/* Process each type in the va_args */
    for (i = va_arg(args, int); i != RST_NONE; i = va_arg(args, int)) {
		for (rs = mon_spell_types; rs->index < RSF_MAX; rs++) {
			if (rs->type & i) {
				rsf_on(f, rs->index);
			}
		}
	}

	va_end(args);

	return;
}